

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall File::writeString(File *this,string *value)

{
  uchar *__ptr;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ByteString toWrite;
  
  if (this->valid == true) {
    ByteString::ByteString(&toWrite,value->_M_string_length);
    __ptr = ByteString::const_byte_str(&toWrite);
    sVar1 = ByteString::size(&toWrite);
    sVar2 = fwrite(__ptr,1,sVar1,(FILE *)this->stream);
    sVar1 = ByteString::size(&toWrite);
    if (sVar2 == sVar1) {
      sVar2 = fwrite((value->_M_dataplus)._M_p,1,value->_M_string_length,(FILE *)this->stream);
      bVar3 = sVar2 == value->_M_string_length;
    }
    else {
      bVar3 = false;
    }
    ByteString::~ByteString(&toWrite);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool File::writeString(const std::string& value)
{
	if (!valid) return false;

	ByteString toWrite((unsigned long) value.size());

	// Write the value to the file
	if ((fwrite(toWrite.const_byte_str(), 1, toWrite.size(), stream) != toWrite.size()) ||
	    (fwrite(&value[0], 1, value.size(), stream) != value.size()))
	{
		return false;
	}

	return true;
}